

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

upb_Message * upb_Array_GetMutable(upb_Array *arr,size_t i)

{
  ulong uVar1;
  upb_Message *puVar2;
  
  if (arr->size_dont_copy_me__upb_internal_use_only <= i) {
    __assert_fail("i < upb_Array_Size(arr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                  ,0x26,"struct upb_Message *upb_Array_GetMutable(upb_Array *, size_t)");
  }
  uVar1 = arr->data_dont_copy_me__upb_internal_use_only;
  if ((((uint)uVar1 & 3) + 1) - (uint)((uVar1 & 3) == 0) == 3) {
    puVar2 = *(upb_Message **)((uVar1 & 0xfffffffffffffff8) + i * 8);
    if (((ulong)puVar2->field_0 & 1) == 0) {
      return puVar2;
    }
    __assert_fail("!upb_Message_IsFrozen(ret)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                  ,0x2c,"struct upb_Message *upb_Array_GetMutable(upb_Array *, size_t)");
  }
  __assert_fail("elem_size == (1 << _upb_Array_ElemSizeLg2_dont_copy_me__upb_internal_use_only(arr))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                ,0x28,"struct upb_Message *upb_Array_GetMutable(upb_Array *, size_t)");
}

Assistant:

upb_Message* upb_Array_GetMutable(upb_Array* arr, size_t i) {
  UPB_ASSERT(i < upb_Array_Size(arr));
  size_t elem_size = sizeof(upb_Message*);
  UPB_ASSERT(elem_size == (1 << UPB_PRIVATE(_upb_Array_ElemSizeLg2)(arr)));
  char* data = upb_Array_MutableDataPtr(arr);
  upb_Message* ret;
  memcpy(&ret, data + (i * elem_size), elem_size);
  UPB_ASSERT(!upb_Message_IsFrozen(ret));
  return ret;
}